

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_write_uint32(void *a,uint32_t *attrib,uint32_t nr_of_attribs,trico_stream_type st)

{
  uint uVar1;
  ssize_t sVar2;
  char *dst;
  int iVar3;
  int __fd;
  uint uVar4;
  ulong __size;
  uint32_t bytes_written;
  uint8_t header;
  uint8_t *b1;
  uint32_t nr_of_attribs_local;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  LZ4_stream_t lz4Stream_body;
  
  header = (uint8_t)st;
  nr_of_attribs_local = nr_of_attribs;
  sVar2 = write((int)&header,(void *)0x1,1);
  iVar3 = 0;
  if ((int)sVar2 != 0) {
    sVar2 = write((int)&nr_of_attribs_local,(void *)0x4,1);
    if ((int)sVar2 != 0) {
      __size = (ulong)nr_of_attribs;
      b1 = (uint8_t *)malloc(__size);
      b2 = (uint8_t *)malloc(__size);
      b3 = (uint8_t *)malloc(__size);
      b4 = (uint8_t *)malloc(__size);
      trico_transpose_uint32_aos_to_soa(&b1,&b2,&b3,&b4,attrib,nr_of_attribs);
      LZ4_initStream(&lz4Stream_body,0x4020);
      iVar3 = 0;
      uVar4 = 0;
      if (nr_of_attribs < 0x7e000001) {
        uVar4 = nr_of_attribs + nr_of_attribs / 0xff + 0x10;
      }
      dst = (char *)malloc((ulong)uVar4);
      uVar1 = LZ4_compress_default((char *)b1,dst,nr_of_attribs,uVar4);
      bytes_written = uVar1;
      sVar2 = write((int)&bytes_written,(void *)0x4,1);
      if ((int)sVar2 != 0) {
        __fd = (int)dst;
        sVar2 = write(__fd,(void *)0x1,(ulong)uVar1);
        if ((int)sVar2 != 0) {
          uVar1 = LZ4_compress_default((char *)b2,dst,nr_of_attribs,uVar4);
          bytes_written = uVar1;
          sVar2 = write((int)&bytes_written,(void *)0x4,1);
          if ((int)sVar2 != 0) {
            sVar2 = write(__fd,(void *)0x1,(ulong)uVar1);
            if ((int)sVar2 != 0) {
              uVar1 = LZ4_compress_default((char *)b3,dst,nr_of_attribs,uVar4);
              bytes_written = uVar1;
              sVar2 = write((int)&bytes_written,(void *)0x4,1);
              if ((int)sVar2 != 0) {
                sVar2 = write(__fd,(void *)0x1,(ulong)uVar1);
                if ((int)sVar2 != 0) {
                  uVar4 = LZ4_compress_default((char *)b4,dst,nr_of_attribs,uVar4);
                  bytes_written = uVar4;
                  sVar2 = write((int)&bytes_written,(void *)0x4,1);
                  if ((int)sVar2 != 0) {
                    sVar2 = write(__fd,(void *)0x1,(ulong)uVar4);
                    if ((int)sVar2 != 0) {
                      free(dst);
                      free(b1);
                      free(b2);
                      free(b3);
                      free(b4);
                      iVar3 = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int trico_write_uint32(void* a, const uint32_t* attrib, uint32_t nr_of_attribs, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)st;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_attribs);

  trico_transpose_uint32_aos_to_soa(&b1, &b2, &b3, &b4, attrib, nr_of_attribs);

  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  unsigned estimateLen = LZ4_COMPRESSBOUND(nr_of_attribs);
  uint8_t* compressed_buf = (uint8_t*)trico_malloc(estimateLen);

  uint32_t bytes_written = (uint32_t)LZ4_compress_default((const char*)b1, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b2, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b3, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b4, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  trico_free(compressed_buf);

  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);

  return 1;
  }